

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
             *this,char **it)

{
  size_t sVar1;
  iterator begin;
  iterator end;
  type pcVar2;
  char *pcVar3;
  char **it_local;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
  *this_local;
  
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(this + 8));
  if (sVar1 != 0) {
    begin = basic_string_view<char>::begin((basic_string_view<char> *)(this + 8));
    end = basic_string_view<char>::end((basic_string_view<char> *)(this + 8));
    pcVar2 = internal::copy_str<char,char_const*,char*>(begin,end,*it);
    *it = pcVar2;
  }
  pcVar3 = std::fill_n<char*,unsigned_long,char>
                     (*it,*(unsigned_long *)(this + 0x20),(char *)(this + 0x18));
  *it = pcVar3;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
            ((bin_writer<3> *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }